

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

ReaderInitializeType __thiscall
duckdb::MultiFileColumnMapper::EvaluateConstantFilters
          (MultiFileColumnMapper *this,ResultColumnMapping *mapping,
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          *remaining_filters)

{
  _Rb_tree_node_base *__k;
  bool bVar1;
  ReaderInitializeType RVar2;
  TableFilterSet *pTVar3;
  iterator iVar4;
  type pTVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  Value constant_value;
  Value local_70;
  
  if ((this->global_filters).ptr == (TableFilterSet *)0x0) {
    RVar2 = INITIALIZED;
  }
  else {
    pTVar3 = optional_ptr<duckdb::TableFilterSet,_true>::operator->(&this->global_filters);
    p_Var7 = &(pTVar3->filters)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var6 = (pTVar3->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var7; p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6))
    {
      __k = p_Var6 + 1;
      iVar4 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)mapping,(key_type *)__k);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
          ._M_cur == (__node_type *)0x0) {
        GetConstantValue(&local_70,this,*(idx_t *)__k);
        pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)&p_Var6[1]._M_parent);
        bVar1 = EvaluateFilterAgainstConstant(this,pTVar5,&local_70);
        Value::~Value(&local_70);
        if (!bVar1) break;
      }
      else {
        pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                            *)&p_Var6[1]._M_parent);
        ::std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>,std::_Select1st<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>>
        ::_M_emplace_unique<unsigned_long_const&,duckdb::TableFilter&>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>,std::_Select1st<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<duckdb::TableFilter>>>>
                    *)remaining_filters,(unsigned_long *)__k,pTVar5);
      }
    }
    RVar2 = (ReaderInitializeType)((_Rb_tree_header *)p_Var6 != p_Var7);
  }
  return RVar2;
}

Assistant:

ReaderInitializeType
MultiFileColumnMapper::EvaluateConstantFilters(ResultColumnMapping &mapping,
                                               map<idx_t, reference<TableFilter>> &remaining_filters) {
	if (!global_filters) {
		return ReaderInitializeType::INITIALIZED;
	}
	auto &global_to_local = mapping.global_to_local;
	for (auto &it : global_filters->filters) {
		auto &global_index = it.first;
		auto &global_filter = it.second;

		auto local_it = global_to_local.find(it.first);
		if (local_it != global_to_local.end()) {
			//! File has this column, filter needs to be evaluated later
			remaining_filters.emplace(global_index, *global_filter);
			continue;
		}

		//! FIXME: this does not check for filters against struct fields that are not present in the file
		auto constant_value = GetConstantValue(global_index);
		if (!EvaluateFilterAgainstConstant(*global_filter, constant_value)) {
			return ReaderInitializeType::SKIP_READING_FILE;
		}
	}
	return ReaderInitializeType::INITIALIZED;
}